

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

Bucket __thiscall
QHashPrivate::Data<QHashPrivate::Node<QWidget_const*,QHashDummyValue>>::
findBucketWithHash<QWidget_const*>
          (Data<QHashPrivate::Node<QWidget_const*,QHashDummyValue>> *this,QWidget **key,size_t hash)

{
  Span *pSVar1;
  Span *pSVar2;
  Span *pSVar3;
  ulong uVar4;
  byte bVar5;
  Bucket BVar6;
  
  pSVar1 = *(Span **)(this + 0x20);
  uVar4 = *(ulong *)(this + 0x10) - 1 & hash;
  pSVar2 = pSVar1 + (uVar4 >> 7);
  uVar4 = (ulong)((uint)uVar4 & 0x7f);
  bVar5 = pSVar2->offsets[uVar4];
  if (bVar5 != 0xff) {
    do {
      if (*(QWidget **)pSVar2->entries[bVar5].storage.data == *key) break;
      uVar4 = uVar4 + 1;
      if (uVar4 == 0x80) {
        pSVar3 = pSVar2 + 1;
        pSVar2 = pSVar1;
        if (((long)pSVar3 - (long)pSVar1 >> 4) * -0x71c71c71c71c71c7 -
            (*(ulong *)(this + 0x10) >> 7) != 0) {
          pSVar2 = pSVar3;
        }
        uVar4 = 0;
      }
      bVar5 = pSVar2->offsets[uVar4];
    } while (bVar5 != 0xff);
  }
  BVar6.index = uVar4;
  BVar6.span = pSVar2;
  return BVar6;
}

Assistant:

Bucket findBucketWithHash(const K &key, size_t hash) const noexcept
    {
        static_assert(std::is_same_v<std::remove_cv_t<Key>, K> ||
                QHashHeterogeneousSearch<std::remove_cv_t<Key>, K>::value);
        Q_ASSERT(numBuckets > 0);
        Bucket bucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
        // loop over the buckets until we find the entry we search for
        // or an empty slot, in which case we know the entry doesn't exist
        while (true) {
            size_t offset = bucket.offset();
            if (offset == SpanConstants::UnusedEntry) {
                return bucket;
            } else {
                Node &n = bucket.nodeAtOffset(offset);
                if (qHashEquals(n.key, key))
                    return bucket;
            }
            bucket.advanceWrapped(this);
        }
    }